

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

void amrex::MultiFab::Xpay
               (MultiFab *dst,Real a,MultiFab *src,int srccomp,int dstcomp,int numcomp,
               IntVect *nghost)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  FabArray<amrex::FArrayBox> *in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dfab;
  Array4<const_double> sfab;
  Box *bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffd70;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  undefined8 in_stack_fffffffffffffd90;
  undefined1 do_tiling_;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  MFIter *in_stack_fffffffffffffdb0;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  int local_210;
  int local_20c;
  int local_208;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  Box local_1ac;
  Box *local_190;
  MFIter local_188;
  int local_11c;
  int local_118;
  int local_114;
  double local_108;
  MFIter *local_f8;
  int local_f0;
  Box *local_e8;
  int local_dc;
  int iStack_d8;
  int local_d4;
  undefined8 local_d0;
  int local_c8;
  Box *local_c0;
  int local_b4;
  int iStack_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  local_11c = in_R8D;
  local_118 = in_ECX;
  local_114 = in_EDX;
  local_108 = in_XMM0_Qa;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (bool)do_tiling_);
  while (bVar1 = MFIter::isValid(&local_188), bVar1) {
    MFIter::growntilebox
              (in_stack_fffffffffffffdb0,
               (IntVect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_190 = &local_1ac;
    bVar1 = Box::ok(local_190);
    if (bVar1) {
      in_stack_fffffffffffffd70 = &local_188;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffffd70);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffffd70);
      local_e8 = local_190;
      local_8 = local_190;
      local_c = 0;
      local_dc = (local_190->smallend).vect[0];
      local_18 = local_190;
      local_1c = 1;
      iStack_d8 = (local_190->smallend).vect[1];
      in_stack_fffffffffffffdb0 = *(MFIter **)(local_190->smallend).vect;
      local_28 = local_190;
      local_2c = 2;
      local_f0 = (local_190->smallend).vect[2];
      local_c0 = local_190;
      local_38 = &local_190->bigend;
      local_3c = 0;
      local_b4 = local_38->vect[0];
      local_48 = &local_190->bigend;
      local_4c = 1;
      in_stack_fffffffffffffda8 = (local_190->bigend).vect[1];
      local_d0 = *(undefined8 *)local_38->vect;
      local_58 = &local_190->bigend;
      local_5c = 2;
      in_stack_fffffffffffffdac = (local_190->bigend).vect[2];
      for (local_274 = 0; local_278 = local_f0, local_f8 = in_stack_fffffffffffffdb0,
          local_d4 = local_f0, local_c8 = in_stack_fffffffffffffdac,
          iStack_b0 = in_stack_fffffffffffffda8, local_ac = in_stack_fffffffffffffdac,
          local_274 < local_11c; local_274 = local_274 + 1) {
        for (; local_27c = iStack_d8, local_278 <= in_stack_fffffffffffffdac;
            local_278 = local_278 + 1) {
          for (; local_280 = local_dc, local_27c <= in_stack_fffffffffffffda8;
              local_27c = local_27c + 1) {
            for (; local_280 <= local_b4; local_280 = local_280 + 1) {
              local_9c = local_280;
              local_a0 = local_27c;
              local_a4 = local_278;
              local_a8 = local_274 + local_114;
              local_98 = &local_1f0;
              local_6c = local_280;
              local_70 = local_27c;
              local_74 = local_278;
              local_78 = local_274 + local_118;
              local_68 = &local_230;
              local_84 = local_280;
              local_88 = local_27c;
              local_8c = local_278;
              local_90 = local_274 + local_118;
              local_80 = &local_230;
              *(double *)
               (local_230 +
               ((long)(local_280 - local_210) + (local_27c - local_20c) * local_228 +
                (local_278 - local_208) * local_220 + local_90 * local_218) * 8) =
                   local_108 *
                   *(double *)
                    (local_230 +
                    ((long)(local_280 - local_210) + (local_27c - local_20c) * local_228 +
                     (local_278 - local_208) * local_220 + local_78 * local_218) * 8) +
                   *(double *)
                    (local_1f0 +
                    ((long)(local_280 - local_1d0) + (local_27c - local_1cc) * local_1e8 +
                     (local_278 - local_1c8) * local_1e0 + local_a8 * local_1d8) * 8);
            }
          }
        }
      }
    }
    MFIter::operator++(&local_188);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd70);
  return;
}

Assistant:

void
MultiFab::Xpay (MultiFab& dst, Real a, const MultiFab& src,
                int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
    BL_ASSERT(dst.boxArray() == src.boxArray());
    BL_ASSERT(dst.distributionMap == src.distributionMap);
    BL_ASSERT(dst.nGrowVect().allGE(nghost) && src.nGrowVect().allGE(nghost));

    BL_PROFILE("MultiFab::Xpay()");

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& srcma = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstma[box_no](i,j,k,n+dstcomp) = srcma[box_no](i,j,k,n+srccomp)
                +                        a * dstma[box_no](i,j,k,n+dstcomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok()) {
                auto const sfab = src.array(mfi);
                auto       dfab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dfab(i,j,k,n+dstcomp) = sfab(i,j,k,n+srccomp) + a * dfab(i,j,k,n+dstcomp);
                });
            }
        }
    }
}